

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TType::TType(TType *this,TTypeList *userDef,TString *n)

{
  char *s;
  TString *pTVar1;
  TString *n_local;
  TTypeList *userDef_local;
  TType *this_local;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_013a9620;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffffff00 | 0xf;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfffff0ff | 0x100;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffff0fff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfff0ffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffefffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffdfffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffbfffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfc7fffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfbffffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xf7ffffff;
  this->arraySizes = (TArraySizes *)0x0;
  (this->field_13).structure = userDef;
  this->fieldName = (TString *)0x0;
  this->typeParameters = (TTypeParameters *)0x0;
  this->spirvType = (TSpirvType *)0x0;
  TSampler::clear(&this->sampler);
  TQualifier::clear(&this->qualifier);
  s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      c_str(n);
  pTVar1 = NewPoolTString_abi_cxx11_(s);
  this->typeName = pTVar1;
  return;
}

Assistant:

TType(TTypeList* userDef, const TString& n) :
                            basicType(EbtStruct), vectorSize(1), matrixCols(0), matrixRows(0), vector1(false), coopmatNV(false), coopmatKHR(false), coopmatKHRuse(0), coopmatKHRUseValid(false), coopvecNV(false),
                            arraySizes(nullptr), structure(userDef), fieldName(nullptr), typeParameters(nullptr),
                            spirvType(nullptr)
                            {
                                sampler.clear();
                                qualifier.clear();
                                typeName = NewPoolTString(n.c_str());
                            }